

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsact.c
# Opt level: O0

void lag_stmt(Item *q1,int blocktype)

{
  long lVar1;
  Symbol *pSVar2;
  long in_RDI;
  Symbol *lagval;
  Symbol *name2;
  Symbol *name1;
  int in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  Item *in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  int t;
  char *s;
  
  t = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  lVar1 = *(long *)(*(long *)(in_RDI + 0x10) + 8);
  delete((Item *)0x116ecf);
  delete((Item *)0x116edf);
  s = *(char **)(*(long *)(in_RDI + 0x10) + 8);
  delete((Item *)0x116f01);
  *(uint *)(lVar1 + 0x34) = *(uint *)(lVar1 + 0x34) | 8;
  *(uint *)(s + 0x34) = *(uint *)(s + 0x34) | 8;
  if (indepsym == (Symbol *)0x0) {
    diag((char *)in_stack_ffffffffffffffd0,
         (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  if ((*(ulong *)(lVar1 + 8) & 0x18) == 0) {
    diag((char *)in_stack_ffffffffffffffd0,
         (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  if ((*(ulong *)(s + 8) & 0x80002) == 0) {
    diag((char *)in_stack_ffffffffffffffd0,
         (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  sprintf(buf,"lag_%s_%s",*(undefined8 *)(lVar1 + 0x48),*(undefined8 *)(s + 0x48));
  pSVar2 = lookup((char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  if (pSVar2 != (Symbol *)0x0) {
    diag((char *)in_stack_ffffffffffffffd0,
         (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  pSVar2 = install(s,t);
  pSVar2->usage = pSVar2->usage | 8;
  pSVar2->subtype = pSVar2->subtype | 8;
  if ((*(ulong *)(lVar1 + 8) & 0x20) != 0) {
    pSVar2->subtype = pSVar2->subtype | 0x20;
    pSVar2->araydim = *(int *)(lVar1 + 0x38);
  }
  if ((pSVar2->subtype & 0x20U) == 0) {
    sprintf(buf,"static double %s;\n",pSVar2->name);
    linsertstr(in_stack_ffffffffffffffd0,
               (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    sprintf(buf,"%s = *lag(&(%s), %s, %s, 0);\n",pSVar2->name,*(undefined8 *)(lVar1 + 0x48),
            indepsym->name,*(undefined8 *)(s + 0x48));
  }
  else {
    sprintf(buf,"static double *%s;\n",pSVar2->name);
    linsertstr(in_stack_ffffffffffffffd0,
               (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    in_stack_ffffffffffffffc8 = pSVar2->araydim;
    sprintf(buf,"%s = lag(%s, %s, %s, %d);\n",pSVar2->name,*(undefined8 *)(lVar1 + 0x48),
            indepsym->name,*(undefined8 *)(s + 0x48));
  }
  replacstr(in_stack_ffffffffffffffd0,
            (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  return;
}

Assistant:

void lag_stmt(q1, blocktype)	/* LAG name1 BY name2 */
	Item *q1;
	int blocktype;
{
	Symbol *name1, *name2, *lagval;

	/*ARGSUSED*/
	/* parse */
	name1 = SYM(q1->next);
	delete(q1->next);
	delete(q1->next);
	name2 = SYM(q1->next);
	delete(q1->next);
	name1->usage |= DEP;
	name2->usage |= DEP;
	/* check */
	if (!indepsym) {
		diag("INDEPENDENT variable must be declared to process",
			" the LAG statement");
	}
	if (!(name1->subtype & (DEP | STAT))) {
		diag(name1->name, " not a STATE or DEPENDENT variable");
	}
	if (!(name2->subtype & (PARM | nmodlCONST))) {
		diag(name2->name, " not a CONSTANT or PARAMETER");
	}
	Sprintf(buf, "lag_%s_%s", name1->name, name2->name);
	if (lookup(buf)) {
		diag(buf, " already in use");
	}
	/* create */
	lagval = install(buf, NAME);
	lagval->usage |= DEP;
	lagval->subtype |= DEP;
	if (name1->subtype & ARRAY) {
		lagval->subtype |= ARRAY;
		lagval->araydim = name1->araydim;
	}
	if (lagval->subtype & ARRAY) {
		Sprintf(buf, "static double *%s;\n", lagval->name);
		Linsertstr(procfunc, buf);
		Sprintf(buf, "%s = lag(%s, %s, %s, %d);\n", lagval->name,
		name1->name, indepsym->name, name2->name, lagval->araydim);
	}else{
		Sprintf(buf, "static double %s;\n", lagval->name);
		Linsertstr(procfunc, buf);
		Sprintf(buf, "%s = *lag(&(%s), %s, %s, 0);\n", lagval->name,
			name1->name, indepsym->name, name2->name);
	}
	replacstr(q1, buf);
}